

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void Curl_http_req_free(httpreq *req)

{
  if (req != (httpreq *)0x0) {
    (*Curl_cfree)(req->scheme);
    (*Curl_cfree)(req->authority);
    (*Curl_cfree)(req->path);
    Curl_dynhds_free(&req->headers);
    Curl_dynhds_free(&req->trailers);
    (*Curl_cfree)(req);
    return;
  }
  return;
}

Assistant:

void Curl_http_req_free(struct httpreq *req)
{
  if(req) {
    free(req->scheme);
    free(req->authority);
    free(req->path);
    Curl_dynhds_free(&req->headers);
    Curl_dynhds_free(&req->trailers);
    free(req);
  }
}